

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Redux.h
# Opt level: O2

Scalar __thiscall
Eigen::DenseBase<Eigen::Matrix<float,1,8,1,1,8>>::
redux<Eigen::internal::scalar_max_op<float,float,0>>
          (DenseBase<Eigen::Matrix<float,1,8,1,1,8>> *this,scalar_max_op<float,_float,_0> *func)

{
  Scalar SVar1;
  ThisEvaluator thisEval;
  redux_evaluator<Eigen::Matrix<float,_1,_8,_1,_1,_8>_> local_8;
  
  local_8.super_evaluator<Eigen::Matrix<float,_1,_8,_1,_1,_8>_>.
  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_1,_8,_1,_1,_8>_>_>.m_d.data =
       (evaluator<Eigen::Matrix<float,_1,_8,_1,_1,_8>_>)
       (evaluator<Eigen::Matrix<float,_1,_8,_1,_1,_8>_>)this;
  SVar1 = internal::
          redux_impl<Eigen::internal::scalar_max_op<float,float,0>,Eigen::internal::redux_evaluator<Eigen::Matrix<float,1,8,1,1,8>>,3,2>
          ::run<Eigen::Matrix<float,1,8,1,1,8>>(&local_8,func,(Matrix<float,_1,_8,_1,_1,_8> *)this);
  return SVar1;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE typename internal::traits<Derived>::Scalar
DenseBase<Derived>::redux(const Func& func) const
{
  eigen_assert(this->rows()>0 && this->cols()>0 && "you are using an empty matrix");

  typedef typename internal::redux_evaluator<Derived> ThisEvaluator;
  ThisEvaluator thisEval(derived());

  // The initial expression is passed to the reducer as an additional argument instead of
  // passing it as a member of redux_evaluator to help  
  return internal::redux_impl<Func, ThisEvaluator>::run(thisEval, func, derived());
}